

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error asmjit::X86Internal::initCallConv(CallConv *cc,uint32_t ccId)

{
  int in_ESI;
  undefined1 *in_RDI;
  uint32_t n_1;
  uint32_t n;
  uint32_t kZdi;
  uint32_t kZsi;
  uint32_t kZbp;
  uint32_t kZsp;
  uint32_t kZdx;
  uint32_t kZcx;
  uint32_t kZbx;
  uint32_t kZax;
  uint32_t kKindK;
  uint32_t kKindMm;
  uint32_t kKindVec;
  uint32_t kKindGp;
  uint32_t overflow_8;
  uint32_t overflow_7;
  uint32_t overflow_6;
  uint32_t overflow_5;
  uint32_t overflow_4;
  uint32_t overflow_3;
  uint32_t overflow_2;
  uint32_t overflow_1;
  uint32_t overflow;
  
  switch(in_ESI) {
  case 0x10:
    break;
  case 0x11:
    in_RDI[3] = 1;
    break;
  case 0x12:
    in_RDI[3] = 1;
    *(undefined4 *)(in_RDI + 8) = 0xffffff01;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 2;
    break;
  case 0x13:
  case 0x14:
    in_RDI[3] = 1;
    *(undefined4 *)(in_RDI + 8) = 0xffff0201;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 6;
    break;
  case 0x15:
    *(undefined4 *)(in_RDI + 8) = 0xffffff00;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 1;
    break;
  case 0x16:
    *(undefined4 *)(in_RDI + 8) = 0xffff0200;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 5;
    break;
  case 0x17:
    *(undefined4 *)(in_RDI + 8) = 0xff010200;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 7;
    break;
  default:
    return 3;
  case 0x1d:
  case 0x1e:
  case 0x1f:
    in_RDI[1] = 1;
    in_RDI[3] = 2;
    in_RDI[4] = 0x10;
    *(undefined4 *)(in_RDI + 8) = 0x6010200;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffff07;
    *(undefined4 *)(in_RDI + 0x28) = 199;
    *(undefined4 *)(in_RDI + 0x18) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x1c) = 0x7060504;
    *(undefined4 *)(in_RDI + 0x30) = 0xff;
    *(undefined4 *)(in_RDI + 0x10) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x14) = 0x7060504;
    *(undefined4 *)(in_RDI + 0x2c) = 0xff;
    *(undefined4 *)(in_RDI + 0x38) = 0xff;
    *(uint *)(in_RDI + 0x3c) =
         (((1 << ((byte)(in_ESI - 0x1dU) & 0x1f)) - 1U | -(uint)(0x1f < in_ESI - 0x1dU)) ^
         0xffffffff) & 0xff;
    *(undefined4 *)(in_RDI + 0x40) = 0xff;
    *(undefined4 *)(in_RDI + 0x44) = 0xff;
    goto LAB_00153627;
  case 0x20:
    in_RDI[1] = 2;
    in_RDI[2] = 1;
    in_RDI[3] = 10;
    in_RDI[4] = 0x10;
    in_RDI[5] = 0x20;
    *(undefined4 *)(in_RDI + 8) = 0x9080201;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x28) = 0x306;
    *(undefined4 *)(in_RDI + 0x10) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x14) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x2c) = 0xf;
    *(undefined4 *)(in_RDI + 0x38) = 0xf0f8;
    *(undefined4 *)(in_RDI + 0x3c) = 0xffc0;
    goto LAB_00153627;
  case 0x21:
    in_RDI[1] = 2;
    in_RDI[3] = 2;
    in_RDI[4] = 0x10;
    *(undefined2 *)(in_RDI + 6) = 0x80;
    *(undefined4 *)(in_RDI + 8) = 0x1020607;
    *(undefined4 *)(in_RDI + 0xc) = 0xffff0908;
    *(undefined4 *)(in_RDI + 0x28) = 0x3c6;
    *(undefined4 *)(in_RDI + 0x10) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x14) = 0x7060504;
    *(undefined4 *)(in_RDI + 0x2c) = 0xff;
    *(undefined4 *)(in_RDI + 0x38) = 0xf038;
    goto LAB_00153627;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    in_RDI[1] = 2;
    in_RDI[3] = 2;
    in_RDI[4] = 0x10;
    *(undefined4 *)(in_RDI + 8) = 0x6010200;
    *(undefined4 *)(in_RDI + 0xc) = 0xffffff07;
    *(undefined4 *)(in_RDI + 0x28) = 199;
    *(undefined4 *)(in_RDI + 0x18) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x1c) = 0x7060504;
    *(undefined4 *)(in_RDI + 0x30) = 0xff;
    *(undefined4 *)(in_RDI + 0x10) = 0x3020100;
    *(undefined4 *)(in_RDI + 0x14) = 0x7060504;
    *(undefined4 *)(in_RDI + 0x2c) = 0xff;
    *(undefined4 *)(in_RDI + 0x38) = 0xffff;
    *(uint *)(in_RDI + 0x3c) =
         ((1 << ((byte)(in_ESI - 0x2dU) & 0x1f)) - 1U | -(uint)(0x1f < in_ESI - 0x2dU)) ^ 0xffffffff
    ;
    *(undefined4 *)(in_RDI + 0x40) = 0xff;
    *(undefined4 *)(in_RDI + 0x44) = 0xff;
    goto LAB_00153627;
  }
  in_RDI[4] = 4;
  in_RDI[1] = 1;
  *(undefined4 *)(in_RDI + 0x38) = 0xf8;
LAB_00153627:
  *in_RDI = (char)in_ESI;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::initCallConv(CallConv& cc, uint32_t ccId) noexcept {
  const uint32_t kKindGp  = X86Reg::kKindGp;
  const uint32_t kKindVec = X86Reg::kKindVec;
  const uint32_t kKindMm  = X86Reg::kKindMm;
  const uint32_t kKindK   = X86Reg::kKindK;

  const uint32_t kZax = X86Gp::kIdAx;
  const uint32_t kZbx = X86Gp::kIdBx;
  const uint32_t kZcx = X86Gp::kIdCx;
  const uint32_t kZdx = X86Gp::kIdDx;
  const uint32_t kZsp = X86Gp::kIdSp;
  const uint32_t kZbp = X86Gp::kIdBp;
  const uint32_t kZsi = X86Gp::kIdSi;
  const uint32_t kZdi = X86Gp::kIdDi;

  switch (ccId) {
    case CallConv::kIdX86StdCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      goto X86CallConv;

    case CallConv::kIdX86MsThisCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      cc.setPassedOrder(kKindGp, kZcx);
      goto X86CallConv;

    case CallConv::kIdX86MsFastCall:
    case CallConv::kIdX86GccFastCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      cc.setPassedOrder(kKindGp, kZcx, kZdx);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm1:
      cc.setPassedOrder(kKindGp, kZax);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm2:
      cc.setPassedOrder(kKindGp, kZax, kZdx);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm3:
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx);
      goto X86CallConv;

    case CallConv::kIdX86CDecl:
X86CallConv:
      cc.setNaturalStackAlignment(4);
      cc.setArchType(ArchInfo::kTypeX86);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, kZsi, kZdi));
      break;

    case CallConv::kIdX86Win64:
      cc.setArchType(ArchInfo::kTypeX64);
      cc.setAlgorithm(CallConv::kAlgorithmWin64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec | CallConv::kFlagIndirectVecArgs);
      cc.setNaturalStackAlignment(16);
      cc.setSpillZoneSize(32);
      cc.setPassedOrder(kKindGp, kZcx, kZdx, 8, 9);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
      cc.setPreservedRegs(kKindVec, Utils::mask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
      break;

    case CallConv::kIdX86SysV64:
      cc.setArchType(ArchInfo::kTypeX64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setRedZoneSize(128);
      cc.setPassedOrder(kKindGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
      break;

    case CallConv::kIdX86FastEval2:
    case CallConv::kIdX86FastEval3:
    case CallConv::kIdX86FastEval4: {
      uint32_t n = ccId - CallConv::kIdX86FastEval2;

      cc.setArchType(ArchInfo::kTypeX86);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx, kZsi, kZdi);
      cc.setPassedOrder(kKindMm, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);

      cc.setPreservedRegs(kKindGp , Utils::bits(8));
      cc.setPreservedRegs(kKindVec, Utils::bits(8) & ~Utils::bits(n));
      cc.setPreservedRegs(kKindMm , Utils::bits(8));
      cc.setPreservedRegs(kKindK  , Utils::bits(8));
      break;
    }

    case CallConv::kIdX64FastEval2:
    case CallConv::kIdX64FastEval3:
    case CallConv::kIdX64FastEval4: {
      uint32_t n = ccId - CallConv::kIdX64FastEval2;

      cc.setArchType(ArchInfo::kTypeX64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx, kZsi, kZdi);
      cc.setPassedOrder(kKindMm, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);

      cc.setPreservedRegs(kKindGp , Utils::bits(16));
      cc.setPreservedRegs(kKindVec,~Utils::bits(n));
      cc.setPreservedRegs(kKindMm , Utils::bits(8));
      cc.setPreservedRegs(kKindK  , Utils::bits(8));
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  cc.setId(ccId);
  return kErrorOk;
}